

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
eastl::vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>::~vector
          (vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator> *this)

{
  basic_string<char,_eastl::allocator> *pbVar1;
  value_type *pvVar2;
  basic_string<char,_eastl::allocator> *pbVar3;
  
  pbVar3 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
           mpBegin;
  pbVar1 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
           mpEnd;
  if (pbVar3 < pbVar1) {
    do {
      pvVar2 = pbVar3->mpBegin;
      if ((pvVar2 != (value_type *)0x0) && (1 < (long)pbVar3->mpCapacity - (long)pvVar2)) {
        operator_delete__(pvVar2);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 < pbVar1);
    pbVar3 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>)
             .mpBegin;
  }
  if (pbVar3 == (basic_string<char,_eastl::allocator> *)0x0) {
    return;
  }
  operator_delete__(pbVar3);
  return;
}

Assistant:

inline vector<T, Allocator>::~vector()
    {
        // Call destructor for the values. Parent class will free the memory.
        DoDestroyValues(mpBegin, mpEnd);
    }